

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O2

void __thiscall
cnn::SimpleRNNBuilder::SimpleRNNBuilder
          (SimpleRNNBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model,
          bool support_lags)

{
  Parameters *pPVar1;
  Parameters *pPVar2;
  bool bVar3;
  undefined1 auVar4 [64];
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<cnn::Parameters_*> __l;
  initializer_list<unsigned_int> x_02;
  Parameters *local_88;
  uint local_80;
  uint local_7c;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> ps;
  Parameters *local_58;
  Parameters *local_50;
  Parameters *local_48;
  
  (this->super_RNNBuilder).cur.t = -1;
  *(undefined8 *)&(this->super_RNNBuilder).sm = 0;
  *(undefined8 *)
   ((long)&(this->super_RNNBuilder).head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4 = ZEXT464(0) << 0x40;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__SimpleRNNBuilder_002e7878;
  this->params = (vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                  )auVar4._0_24_;
  this->param_vars =
       (vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
        )auVar4._24_24_;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar4._48_8_;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar4._56_8_;
  *(undefined1 (*) [64])
   &(this->param_vars).
    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar4;
  this->layers = layers;
  this->lagging = support_lags;
  while (bVar3 = layers != 0, layers = layers - 1, bVar3) {
    x._M_len = 2;
    x._M_array = (iterator)&ps;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = input_dim;
    Dim::Dim((Dim *)&local_58,x);
    pPVar1 = Model::add_parameters(model,(Dim *)&local_58,0.0);
    x_00._M_len = 2;
    x_00._M_array = (iterator)&ps;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_58,x_00);
    pPVar2 = Model::add_parameters(model,(Dim *)&local_58,0.0);
    x_01._M_len = 1;
    x_01._M_array = (iterator)&ps;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_58,x_01);
    local_48 = Model::add_parameters(model,(Dim *)&local_58,0.0);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_58;
    local_58 = pPVar1;
    local_50 = pPVar2;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::vector
              (&ps,__l,(allocator_type *)&local_88);
    if (this->lagging == true) {
      x_02._M_len = 2;
      x_02._M_array = &local_80;
      local_80 = hidden_dim;
      local_7c = hidden_dim;
      Dim::Dim((Dim *)&local_58,x_02);
      local_88 = Model::add_parameters(model,(Dim *)&local_58,0.0);
      std::vector<cnn::Parameters*,std::allocator<cnn::Parameters*>>::emplace_back<cnn::Parameters*>
                ((vector<cnn::Parameters*,std::allocator<cnn::Parameters*>> *)&ps,&local_88);
    }
    std::
    vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
    ::push_back(&this->params,(value_type *)&ps);
    std::_Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::~_Vector_base
              ((_Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)&ps);
    input_dim = hidden_dim;
  }
  return;
}

Assistant:

SimpleRNNBuilder::SimpleRNNBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       Model* model,
                       bool support_lags) : layers(layers), lagging(support_lags) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    Parameters* p_x2h = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2h = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_hb = model->add_parameters({hidden_dim});
    vector<Parameters*> ps = {p_x2h, p_h2h, p_hb};
    if (lagging)
        ps.push_back(model->add_parameters({hidden_dim, hidden_dim}));
    params.push_back(ps);
    layer_input_dim = hidden_dim;
  }
}